

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetrahedron_monte_carlo.cpp
# Opt level: O2

double * tetrahedron01_sample(int n,int *seed)

{
  double *pdVar1;
  double *a;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  
  uVar6 = 0;
  uVar4 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar4 = (long)(n * 3) << 3;
  }
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar6;
  }
  pdVar1 = (double *)operator_new__(uVar4);
  pdVar3 = pdVar1;
  for (; uVar6 != uVar2; uVar6 = uVar6 + 1) {
    a = r8vec_uniform_01_new(4,seed);
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      dVar7 = log(a[lVar5]);
      a[lVar5] = -dVar7;
    }
    dVar7 = r8vec_sum(4,a);
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      pdVar3[lVar5] = a[lVar5] / dVar7;
    }
    if (a != (double *)0x0) {
      operator_delete__(a);
    }
    pdVar3 = pdVar3 + 3;
  }
  return pdVar1;
}

Assistant:

double *tetrahedron01_sample ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    TETRAHEDRON01_SAMPLE samples the unit tetrahedron in 3D.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    15 January 2015
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Reuven Rubinstein,
//    Monte Carlo Optimization, Simulation, and Sensitivity 
//    of Queueing Networks,
//    Krieger, 1992,
//    ISBN: 0894647644,
//    LC: QA298.R79.
//
//  Parameters:
//
//    Input, int N, the number of points.
//
//    Input/output, int &SEED, a seed for the random 
//    number generator.
//
//    Output, double TETRAHEDRON01_SAMPLE_01[3*N], the points.
//
{
  double *e;
  double e_sum;
  int i;
  int j;
  const int m = 3;
  double *x;

  x = new double[m*n];

  for ( j = 0; j < n; j++ )
  {
    e = r8vec_uniform_01_new ( m + 1, seed );

    for ( i = 0; i < m + 1; i++ )
    {
      e[i] = - log ( e[i] );
    }
    e_sum = r8vec_sum ( m + 1, e );

    for ( i = 0; i < m; i++ )
    {
      x[i+j*m] = e[i] / e_sum;
    }
    delete [] e;
  }

  return x;
}